

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumStatement
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int path2;
  EnumOptions *options;
  EnumValueDescriptorProto *enum_value;
  undefined1 local_60 [8];
  LocationRecorder location_1;
  undefined1 local_40 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *enum_location_local;
  EnumDescriptorProto *enum_type_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = LookingAt(this,"option");
    if (bVar1) {
      LocationRecorder::LocationRecorder((LocationRecorder *)local_40,enum_location,3);
      options = EnumDescriptorProto::mutable_options(enum_type);
      this_local._7_1_ =
           ParseOption(this,&options->super_Message,(LocationRecorder *)local_40,
                       (FileDescriptorProto *)location.location_,OPTION_STATEMENT);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_40);
    }
    else {
      path2 = EnumDescriptorProto::value_size(enum_type);
      LocationRecorder::LocationRecorder((LocationRecorder *)local_60,enum_location,2,path2);
      enum_value = EnumDescriptorProto::add_value(enum_type);
      this_local._7_1_ =
           ParseEnumConstant(this,enum_value,(LocationRecorder *)local_60,
                             (FileDescriptorProto *)location.location_);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_60);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseEnumStatement(EnumDescriptorProto* enum_type,
                                const LocationRecorder& enum_location,
                                const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kOptionsFieldNumber);
    return ParseOption(enum_type->mutable_options(), location,
                       containing_file, OPTION_STATEMENT);
  } else {
    LocationRecorder location(enum_location,
        EnumDescriptorProto::kValueFieldNumber, enum_type->value_size());
    return ParseEnumConstant(enum_type->add_value(), location, containing_file);
  }
}